

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O2

bool Function_Template::form1_SetPixel(SetPixelForm1 SetPixel)

{
  uint8_t value;
  bool bVar1;
  uint x;
  uint y;
  vector<unsigned_char,_std::allocator<unsigned_char>_> intensity;
  Image image;
  ImageTemplate<unsigned_char> local_48;
  
  Unit_Test::intensityArray(&intensity,2);
  value = *intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&local_48,0,0,'\x01','\x01');
  Test_Helper::uniformImage(&image,value,0,0,&local_48);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&local_48);
  x = Test_Helper::randomValue<unsigned_int>(0,image._width);
  y = Test_Helper::randomValue<unsigned_int>(0,image._height);
  (*SetPixel)(&image,x,y,
              intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start[1]);
  bVar1 = Unit_Test::verifyImage
                    (&image,x,y,1,1,
                     intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start[1]);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&image);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return bVar1;
}

Assistant:

bool form1_SetPixel(SetPixelForm1 SetPixel)
    {
        const std::vector < uint8_t > intensity = intensityArray( 2 );
        PenguinV_Image::Image image  = uniformImage( intensity[0] );
        const uint32_t x = randomValue<uint32_t>( 0, image.width() );
        const uint32_t y = randomValue<uint32_t>( 0, image.height() );

        SetPixel( image, x, y, intensity[1] );

        return verifyImage( image, x, y, 1, 1, intensity[1] );
    }